

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<short,short,short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool,false,true>
               (short *ldata,short *rdata,short *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  ushort uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  short rentry_1;
  short rentry;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar1 = *rdata;
      iVar4 = 0;
      do {
        result_data[iVar4] = ldata[iVar4] | uVar1;
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar8 = 0;
    do {
      uVar3 = puVar2[uVar5];
      uVar6 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar6 = count;
      }
      uVar7 = uVar6;
      if (uVar3 != 0) {
        uVar7 = uVar8;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar8 < uVar6) {
            uVar1 = *rdata;
            do {
              result_data[uVar8] = ldata[uVar8] | uVar1;
              uVar8 = uVar8 + 1;
              uVar7 = uVar6;
            } while (uVar6 != uVar8);
          }
        }
        else if (uVar8 < uVar6) {
          uVar9 = 0;
          do {
            if ((uVar3 >> (uVar9 & 0x3f) & 1) != 0) {
              result_data[uVar8 + uVar9] = *rdata | ldata[uVar8 + uVar9];
            }
            uVar9 = uVar9 + 1;
            uVar7 = uVar6;
          } while (uVar6 - uVar8 != uVar9);
        }
      }
      uVar5 = uVar5 + 1;
      uVar8 = uVar7;
    } while (uVar5 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}